

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example9.cpp
# Opt level: O0

int main(void)

{
  Medium med;
  Box *pBVar1;
  PointLight *this;
  ColorMap *this_00;
  Scene *pSVar2;
  PlaneMap *this_01;
  Vector local_170;
  Vector local_158;
  Vector local_140;
  Vector local_128;
  Vector local_110;
  double local_f8;
  double local_f0;
  Vector local_e8;
  Vector local_d0;
  Scene *local_b8;
  Scene *scene;
  ColorMap *cmap;
  BmpImage *img;
  PointLight *local_88;
  LightSource *Light1;
  Vector local_68;
  Vector local_50;
  Vector local_28;
  Box *local_10;
  Box *b;
  
  pBVar1 = (Box *)operator_new(400);
  Vector::Vector(&local_28,0.0,-2.0,5.0);
  Vector::Vector(&local_50,8.0,0.0,3.0);
  Vector::Vector(&local_68,-8.0,0.0,3.0);
  Vector::Vector((Vector *)&Light1,0.0,-3.0,0.0);
  Box::Box(pBVar1,&local_28,&local_50,&local_68,(Vector *)&Light1);
  local_10 = pBVar1;
  this = (PointLight *)operator_new(0x40);
  Vector::Vector((Vector *)&img,7.0,10.0,-10.0);
  PointLight::PointLight(this,(Vector *)&img,20.0);
  local_88 = this;
  this_00 = (ColorMap *)operator_new(0x20);
  BmpImage::BmpImage((BmpImage *)this_00,"backgnd.bmp");
  cmap = this_00;
  pSVar2 = (Scene *)operator_new(0x68);
  ColorMap::ColorMap((ColorMap *)pSVar2,(Image *)cmap);
  scene = pSVar2;
  Vector::operator=((Vector *)
                    &(pSVar2->envFog).super___shared_ptr<Fog,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,25.0);
  pSVar2 = (Scene *)operator_new(0xe8);
  Scene::Scene(pSVar2);
  local_b8 = pSVar2;
  this_01 = (PlaneMap *)operator_new(0x38);
  Vector::Vector(&local_d0,0.0,-1.0,-1.0);
  Vector::Vector(&local_e8,1.0,0.0,0.0);
  PlaneMap::PlaneMap(this_01,&local_d0,&local_e8);
  (local_10->super_GeometricObject).mapping = (Map *)this_01;
  GeometricObject::add(&local_10->super_GeometricObject,(Texture *)scene);
  GeometricObject::ambient(&local_10->super_GeometricObject,0.3);
  GeometricObject::diffuse(&local_10->super_GeometricObject,0.8);
  GeometricObject::specular(&local_10->super_GeometricObject,0.3);
  GeometricObject::reflection(&local_10->super_GeometricObject,0.0);
  GeometricObject::ior(&local_10->super_GeometricObject,0.0);
  GeometricObject::phong_size(&local_10->super_GeometricObject,5);
  local_f8 = Grayzer::Medium::glass.ior;
  local_f0 = Grayzer::Medium::glass.beta;
  med.beta = Grayzer::Medium::glass.beta;
  med.ior = Grayzer::Medium::glass.ior;
  GeometricObject::medium(&local_10->super_GeometricObject,med);
  pBVar1 = local_10;
  Vector::Vector(&local_110,1.0);
  GeometricObject::color(&pBVar1->super_GeometricObject,&local_110);
  Scene::add(local_b8,&local_10->super_GeometricObject);
  Scene::add(local_b8,&local_88->super_LightSource);
  pSVar2 = local_b8;
  Vector::Vector(&local_128,0.196078,0.6,0.8);
  Scene::setBackground(pSVar2,&local_128);
  pSVar2 = local_b8;
  Vector::Vector(&local_140,0.0);
  Vector::Vector(&local_158,0.0,0.0,1.0);
  Vector::Vector(&local_170,0.0,1.0,0.0);
  Scene::setCamera(pSVar2,&local_140,&local_158,&local_170);
  render_scene(local_b8,1.6,1.0,0x140,200,"SAMPLE90.TGA");
  return 0;
}

Assistant:

int main()
{
    Box *b = new Box(Vector(0,-2,5),Vector(8,0,3),Vector(-8,0,3),Vector(0,-3,0));
//  Sphere *s = new Sphere(Vector(0,0,5),50);
    LightSource *Light1 = new PointLight(Vector(7,10,-10),20);
    BmpImage *img = new BmpImage("backgnd.bmp");
    ColorMap *cmap = new ColorMap(img);

    cmap->scale = 25;

    Scene* scene = new Scene;

    b->mapping = new PlaneMap(Vector(0,-1,-1),Vector(1,0,0));
    b->add(cmap);
    b->ambient(0.3);
    b->diffuse(0.8);
    b->specular(0.3);
    b->reflection(0.0);
    b->ior(0.0);
    b->phong_size(5);
    b->medium(Grayzer::Medium::glass);
    b->color(1);

    scene->add(b);
    scene->add(Light1);

    scene->setBackground(SkyBlue);
    scene->setCamera(Vector(0),Vector(0,0,1),Vector(0,1,0));
    render_scene(scene, 1.6,1.0,320,200,"SAMPLE90.TGA");
}